

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_decoding_backend_init_memory__flac
                    (void *pUserData,void *pData,size_t dataSize,ma_decoding_backend_config *pConfig
                    ,ma_allocation_callbacks *pAllocationCallbacks,ma_data_source **ppBackend)

{
  ma_decoding_backend_config pFlac_00;
  void *in_RCX;
  size_t in_R8;
  ma_decoding_backend_config *in_R9;
  ma_flac *pFlac;
  ma_result result;
  size_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 local_4;
  
  pFlac_00 = (ma_decoding_backend_config)
             ma_malloc(in_stack_ffffffffffffffb8,(ma_allocation_callbacks *)0x214611);
  if (pFlac_00 == (ma_decoding_backend_config)0x0) {
    local_4 = MA_OUT_OF_MEMORY;
  }
  else {
    local_4 = ma_flac_init_memory(in_RCX,in_R8,in_R9,
                                  (ma_allocation_callbacks *)
                                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                  (ma_flac *)pFlac_00);
    if (local_4 == MA_SUCCESS) {
      *in_R9 = pFlac_00;
      local_4 = MA_SUCCESS;
    }
    else {
      ma_free((void *)CONCAT44(local_4,in_stack_ffffffffffffffc0),
              (ma_allocation_callbacks *)pFlac_00);
    }
  }
  return local_4;
}

Assistant:

static ma_result ma_decoding_backend_init_memory__flac(void* pUserData, const void* pData, size_t dataSize, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_data_source** ppBackend)
{
    ma_result result;
    ma_flac* pFlac;

    (void)pUserData;    /* For now not using pUserData, but once we start storing the vorbis decoder state within the ma_decoder structure this will be set to the decoder so we can avoid a malloc. */

    /* For now we're just allocating the decoder backend on the heap. */
    pFlac = (ma_flac*)ma_malloc(sizeof(*pFlac), pAllocationCallbacks);
    if (pFlac == NULL) {
        return MA_OUT_OF_MEMORY;
    }

    result = ma_flac_init_memory(pData, dataSize, pConfig, pAllocationCallbacks, pFlac);
    if (result != MA_SUCCESS) {
        ma_free(pFlac, pAllocationCallbacks);
        return result;
    }

    *ppBackend = pFlac;

    return MA_SUCCESS;
}